

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_writer_reader_phaser.c
# Opt level: O0

int hdr_writer_reader_phaser_init(hdr_writer_reader_phaser *p)

{
  hdr_mutex *phVar1;
  int rc;
  hdr_writer_reader_phaser *p_local;
  
  if (p == (hdr_writer_reader_phaser *)0x0) {
    p_local._4_4_ = 0x16;
  }
  else {
    p->start_epoch = 0;
    p->even_end_epoch = 0;
    p->odd_end_epoch = -0x8000000000000000;
    phVar1 = hdr_mutex_alloc();
    p->reader_mutex = phVar1;
    if (p->reader_mutex == (hdr_mutex *)0x0) {
      p_local._4_4_ = 0xc;
    }
    else {
      p_local._4_4_ = hdr_mutex_init(p->reader_mutex);
      if (p_local._4_4_ == 0) {
        p_local._4_4_ = 0;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int hdr_writer_reader_phaser_init(struct hdr_writer_reader_phaser* p)
{
    int rc;
    if (NULL == p)
    {
        return EINVAL;
    }

    p->start_epoch = 0;
    p->even_end_epoch = 0;
    p->odd_end_epoch = INT64_MIN;
    p->reader_mutex = hdr_mutex_alloc();

    if (!p->reader_mutex)
    {
        return ENOMEM;
    }

    rc = hdr_mutex_init(p->reader_mutex);
    if (0 != rc)
    {
        return rc;
    }

    /* TODO: Should I fence here. */

    return 0;
}